

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

void kratos::check_active_high(Generator *top)

{
  undefined1 local_e0 [8];
  ActiveVisitor visitor;
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_e0 = (undefined1  [8])&PTR_visit_root_004d2808;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
       (__node_base_ptr)&visitor.reset_map_._M_h._M_rehash_policy._M_next_resize;
  visitor.reset_map_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.reset_map_._M_h._M_bucket_count = 0;
  visitor.reset_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.reset_map_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.reset_map_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.reset_map_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.reset_map_._M_h._M_rehash_policy._M_next_resize = 0;
  visitor.reset_map_._M_h._M_single_bucket =
       (__node_base_ptr)&visitor.reset_stmt_._M_h._M_rehash_policy._M_next_resize;
  visitor.reset_stmt_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.reset_stmt_._M_h._M_bucket_count = 0;
  visitor.reset_stmt_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.reset_stmt_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.reset_stmt_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.reset_stmt_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.reset_stmt_._M_h._M_rehash_policy._M_next_resize = 0;
  IRVisitor::visit_root_s((IRVisitor *)local_e0,&top->super_IRNode);
  local_e0 = (undefined1  [8])&PTR_visit_root_004d2808;
  std::
  _Hashtable<kratos::Port_*,_std::pair<kratos::Port_*const,_kratos::Stmt_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Stmt_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Port_*,_std::pair<kratos::Port_*const,_kratos::Stmt_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Stmt_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&visitor.reset_map_._M_h._M_single_bucket);
  std::
  _Hashtable<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  local_e0 = (undefined1  [8])&PTR_visit_root_004cd278;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&visitor.super_IRVisitor.level);
  return;
}

Assistant:

void check_active_high(Generator* top) {
    ActiveVisitor visitor;
    visitor.visit_root_s(top);
}